

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O2

dictionary * iniparser_load(char *ininame)

{
  char cVar1;
  int iVar2;
  uint len;
  FILE *__stream;
  dictionary *d;
  char *pcVar3;
  size_t sVar4;
  ushort **ppuVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  char *__s;
  int local_1894;
  char val [1025];
  char cStack_1469;
  char line [1025];
  char section [1025];
  char key [1025];
  char tmp [2049];
  
  __stream = fopen(ininame,"r");
  if (__stream == (FILE *)0x0) {
    d = (dictionary *)0x0;
    fprintf(_stderr,"iniparser: cannot open %s\n",ininame);
  }
  else {
    d = dictionary_new(0);
    if (d == (dictionary *)0x0) {
LAB_0010d6aa:
      fclose(__stream);
      d = (dictionary *)0x0;
    }
    else {
      memset(line,0,0x400);
      memset(section,0,0x400);
      memset(key,0,0x400);
      memset(val,0,0x400);
      uVar8 = 0;
      local_1894 = 0;
      do {
        uVar7 = 0;
        do {
          do {
            pcVar3 = fgets(line + uVar7,0x400 - (int)uVar7,__stream);
            if (pcVar3 == (char *)0x0) {
              if (local_1894 == 0) goto LAB_0010d658;
              goto LAB_0010d645;
            }
            uVar8 = uVar8 + 1;
            sVar4 = strlen(line);
            uVar6 = (long)(int)sVar4 - 1;
          } while ((int)uVar6 == 0);
          if ((line[(long)(int)sVar4 + -1] != '\n') && (iVar2 = feof(__stream), iVar2 == 0)) {
            fprintf(_stderr,"iniparser: input line too long in %s (%d)\n",ininame,(ulong)uVar8);
            dictionary_del(d);
            goto LAB_0010d6aa;
          }
          while (iVar2 = (int)uVar6, -1 < iVar2) {
            cVar1 = line[uVar6 & 0xffffffff];
            if (((long)cVar1 != 10) &&
               (ppuVar5 = __ctype_b_loc(),
               (*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) == 0)) break;
            line[uVar6 & 0xffffffff] = '\0';
            uVar6 = (ulong)(iVar2 - 1);
          }
          uVar7 = uVar6 & 0xffffffff;
          if (iVar2 < 1) {
            uVar7 = 0;
          }
        } while (line[uVar7] == '\\');
        sVar4 = strlen(line);
        pcVar3 = (char *)malloc(sVar4);
        strcpy(pcVar3,line);
        len = strstrip(pcVar3);
        if (((len == 0) || (cVar1 = *pcVar3, cVar1 == '#')) || (cVar1 == ';')) {
          free(pcVar3);
        }
        else {
          if ((cVar1 == '[') && (pcVar3[(ulong)len - 1] == ']')) {
            __s = section;
            __isoc99_sscanf(pcVar3,"[%[^]]",__s);
            strstrip(__s);
            strlwc(__s,__s,len);
            free(pcVar3);
            pcVar3 = (char *)0x0;
          }
          else {
            iVar2 = __isoc99_sscanf(pcVar3,"%[^=] = \"%[^\"]\"",key,val);
            if ((iVar2 == 2) ||
               ((iVar2 = __isoc99_sscanf(pcVar3,"%[^=] = \'%[^\']\'",key,val), iVar2 == 2 ||
                (iVar2 = __isoc99_sscanf(pcVar3,"%[^=] = %[^;#]",key,val), iVar2 == 2)))) {
              strstrip(key);
              strlwc(key,key,len);
              strstrip(val);
              if (val[0] == '\'') {
                if (val[1] == '\'') goto LAB_0010d53c;
              }
              else if ((val[0] == '\"') && (val[1] == '\"')) {
LAB_0010d53c:
                if (val[2] == '\0') goto LAB_0010d597;
              }
            }
            else {
              iVar2 = __isoc99_sscanf(pcVar3,"%[^=] = %[;#]",key,val);
              if ((iVar2 != 2) && (iVar2 = __isoc99_sscanf(pcVar3,"%[^=] %[=]",key,val), iVar2 != 2)
                 ) {
                free(pcVar3);
                fprintf(_stderr,"iniparser: syntax error in %s (%d):\n",ininame,(ulong)uVar8);
                fprintf(_stderr,"-> %s\n",line);
                local_1894 = local_1894 + 1;
                goto LAB_0010d5de;
              }
              strstrip(key);
              strlwc(key,key,len);
LAB_0010d597:
              val[0] = '\0';
            }
            free(pcVar3);
            __s = tmp;
            sprintf(__s,"%s:%s",section,key);
            pcVar3 = val;
          }
          local_1894 = dictionary_set(d,__s,pcVar3);
        }
LAB_0010d5de:
        memset(line,0,0x400);
      } while (-1 < local_1894);
      fwrite("iniparser: memory allocation failure\n",0x25,1,_stderr);
LAB_0010d645:
      dictionary_del(d);
      d = (dictionary *)0x0;
LAB_0010d658:
      fclose(__stream);
    }
  }
  return d;
}

Assistant:

dictionary * iniparser_load(const char * ininame)
{
    FILE * in ;

    char line    [ASCIILINESZ+1] ;
    char section [ASCIILINESZ+1] ;
    char key     [ASCIILINESZ+1] ;
    char tmp     [(ASCIILINESZ * 2) + 1] ;
    char val     [ASCIILINESZ+1] ;

    int  last=0 ;
    int  len ;
    int  lineno=0 ;
    int  errs=0;

    dictionary * dict ;

    if ((in=fopen(ininame, "r"))==NULL) {
        fprintf(stderr, "iniparser: cannot open %s\n", ininame);
        return NULL ;
    }

    dict = dictionary_new(0) ;
    if (!dict) {
        fclose(in);
        return NULL ;
    }

    memset(line,    0, ASCIILINESZ);
    memset(section, 0, ASCIILINESZ);
    memset(key,     0, ASCIILINESZ);
    memset(val,     0, ASCIILINESZ);
    last=0 ;

    while (fgets(line+last, ASCIILINESZ-last, in)!=NULL) {
        lineno++ ;
        len = (int)strlen(line)-1;
        if (len==0)
            continue;
        /* Safety check against buffer overflows */
        if (line[len]!='\n' && !feof(in)) {
            fprintf(stderr,
                    "iniparser: input line too long in %s (%d)\n",
                    ininame,
                    lineno);
            dictionary_del(dict);
            fclose(in);
            return NULL ;
        }
        /* Get rid of \n and spaces at end of line */
        while ((len>=0) &&
                ((line[len]=='\n') || (isspace(line[len])))) {
            line[len]=0 ;
            len-- ;
        }
        if (len < 0) { /* Line was entirely \n and/or spaces */
            len = 0;
        }
        /* Detect multi-line */
        if (line[len]=='\\') {
            /* Multi-line value */
            last=len ;
            continue ;
        } else {
            last=0 ;
        }
        switch (iniparser_line(line, section, key, val)) {
            case LINE_EMPTY:
            case LINE_COMMENT:
            break ;

            case LINE_SECTION:
            errs = dictionary_set(dict, section, NULL);
            break ;

            case LINE_VALUE:
            sprintf(tmp, "%s:%s", section, key);
            errs = dictionary_set(dict, tmp, val) ;
            break ;

            case LINE_ERROR:
            fprintf(stderr, "iniparser: syntax error in %s (%d):\n",
                    ininame,
                    lineno);
            fprintf(stderr, "-> %s\n", line);
            errs++ ;
            break;

            default:
            break ;
        }
        memset(line, 0, ASCIILINESZ);
        last=0;
        if (errs<0) {
            fprintf(stderr, "iniparser: memory allocation failure\n");
            break ;
        }
    }
    if (errs) {
        dictionary_del(dict);
        dict = NULL ;
    }
    fclose(in);
    return dict ;
}